

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int i_00;
  
  for (i_00 = 0; i_00 < *(int *)(in_RDI + 0x40); i_00 = i_00 + 1) {
    ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x40),i_00);
    IM_DELETE<ImFont>((ImFont *)0x15c930);
  }
  ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)CONCAT44(i_00,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < Fonts.Size; i++)
        IM_DELETE(Fonts[i]);
    Fonts.clear();
}